

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O2

void __thiscall crnlib::dxt_image::init_task(dxt_image *this,uint64 data,void *pData_ptr)

{
  int *piVar1;
  pack_params *p;
  crn_thread_id_t cVar2;
  long lVar3;
  bool bVar4;
  crn_thread_id_t cVar5;
  uchar *puVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint x;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint local_fac;
  uint local_f90;
  color_quad_u8 pixels [16];
  set_block_pixels_context optimizer_context;
  
  piVar1 = *(int **)((long)pData_ptr + 8);
  p = *(pack_params **)((long)pData_ptr + 0x10);
  cVar5 = crn_get_current_thread_id();
  cVar2 = *(crn_thread_id_t *)((long)pData_ptr + 0x18);
  set_block_pixels_context::set_block_pixels_context(&optimizer_context);
  uVar7 = 0;
  local_fac = 0xffffffff;
  uVar16 = 0;
  do {
    if (this->m_blocks_y <= uVar7) {
LAB_0016d92c:
      set_block_pixels_context::~set_block_pixels_context(&optimizer_context);
      return;
    }
    for (uVar9 = 0; uVar9 < this->m_blocks_x; uVar9 = uVar9 + 1) {
      if (*(long *)((long)pData_ptr + 0x20) != 0) goto LAB_0016d92c;
      if (((~uVar16 & 0x3f) == 0 && cVar5 == cVar2) &&
          p->m_pProgress_callback != (progress_callback_func)0x0) {
        uVar10 = this->m_blocks_x * this->m_blocks_y;
        uVar15 = ((uVar10 >> 1) + p->m_progress_range * uVar16) / uVar10 + p->m_progress_start;
        if (uVar15 != local_fac) {
          bVar4 = (*p->m_pProgress_callback)(uVar15,p->m_pProgress_callback_user_data_ptr);
          local_fac = uVar15;
          if (!bVar4) {
            LOCK();
            *(undefined8 *)((long)pData_ptr + 0x20) = 1;
            UNLOCK();
            goto LAB_0016d92c;
          }
        }
      }
      if ((p->m_num_helper_threads == 0) ||
         (local_f90 = (uint)data, uVar16 % (p->m_num_helper_threads + 1) == local_f90)) {
        puVar6 = &pixels[0].field_0.field_0.a;
        for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
          uVar11 = (uint)lVar8 | (uint)uVar7 * 4;
          uVar10 = piVar1[1] - 1U;
          if (uVar11 < piVar1[1] - 1U) {
            uVar10 = uVar11;
          }
          for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
            uVar12 = (uint)lVar14 | (uint)uVar9 * 4;
            uVar11 = *piVar1 - 1U;
            if (uVar12 < *piVar1 - 1U) {
              uVar11 = uVar12;
            }
            lVar3 = *(long *)(piVar1 + 6);
            uVar13 = (ulong)(piVar1[2] * uVar10 + uVar11);
            puVar6[lVar14 * 4 + -3] = *(uchar *)(lVar3 + uVar13 * 4);
            puVar6[lVar14 * 4 + -2] = *(uchar *)(lVar3 + 1 + uVar13 * 4);
            puVar6[lVar14 * 4 + -1] = *(uchar *)(lVar3 + 2 + uVar13 * 4);
            puVar6[lVar14 * 4] = *(uchar *)(lVar3 + 3 + uVar13 * 4);
          }
          puVar6 = puVar6 + 0x10;
        }
        set_block_pixels(this,(uint)uVar9,(uint)uVar7,pixels,p,&optimizer_context);
      }
      uVar16 = uVar16 + 1;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void dxt_image::init_task(uint64 data, void* pData_ptr)
    {
        const uint thread_index = static_cast<uint>(data);
        init_task_params* pInit_params = static_cast<init_task_params*>(pData_ptr);

        const image_u8& img = *pInit_params->m_pImg;
        const pack_params& p = *pInit_params->m_pParams;
        const bool is_main_thread = (crn_get_current_thread_id() == pInit_params->m_main_thread);

        uint block_index = 0;

        set_block_pixels_context optimizer_context;
        int prev_progress_percentage = -1;

        for (uint block_y = 0; block_y < m_blocks_y; block_y++)
        {
            const uint pixel_ofs_y = block_y * cDXTBlockSize;

            for (uint block_x = 0; block_x < m_blocks_x; block_x++, block_index++)
            {
                if (pInit_params->m_canceled)
                {
                    return;
                }

                if (p.m_pProgress_callback && is_main_thread && ((block_index & 63) == 63))
                {
                    const uint progress_percentage = p.m_progress_start + ((block_index * p.m_progress_range + get_total_blocks() / 2) / get_total_blocks());
                    if ((int)progress_percentage != prev_progress_percentage)
                    {
                        prev_progress_percentage = progress_percentage;
                        if (!(p.m_pProgress_callback)(progress_percentage, p.m_pProgress_callback_user_data_ptr))
                        {
                            atomic_exchange32(&pInit_params->m_canceled, CRNLIB_TRUE);
                            return;
                        }
                    }
                }

                if (p.m_num_helper_threads)
                {
                    if ((block_index % (p.m_num_helper_threads + 1)) != thread_index)
                    {
                        continue;
                    }
                }

                color_quad_u8 pixels[cDXTBlockSize * cDXTBlockSize];

                const uint pixel_ofs_x = block_x * cDXTBlockSize;

                for (uint y = 0; y < cDXTBlockSize; y++)
                {
                    const uint iy = math::minimum(pixel_ofs_y + y, img.get_height() - 1);

                    for (uint x = 0; x < cDXTBlockSize; x++)
                    {
                        const uint ix = math::minimum(pixel_ofs_x + x, img.get_width() - 1);

                        pixels[x + y * cDXTBlockSize] = img(ix, iy);
                    }
                }

                set_block_pixels(block_x, block_y, pixels, p, optimizer_context);
            }
        }
    }